

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_ChooseExpression
          (SyntaxDumper *this,ExtGNU_ChooseExpressionSyntax *node)

{
  ExtGNU_ChooseExpressionSyntax local_50 [56];
  
  ExtGNU_ChooseExpressionSyntax::keyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  ExtGNU_ChooseExpressionSyntax::openParenthesisToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x38));
  ExtGNU_ChooseExpressionSyntax::commaToken1(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x48));
  ExtGNU_ChooseExpressionSyntax::commaToken2(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x58));
  ExtGNU_ChooseExpressionSyntax::closeParenthesisToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_ChooseExpression(const ExtGNU_ChooseExpressionSyntax* node) override
    {
        terminal(node->keyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->constantExpression());
        terminal(node->commaToken1(), node);
        nonterminal(node->expression1());
        terminal(node->commaToken2(), node);
        nonterminal(node->expression2());
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }